

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O1

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  pointer pcVar1;
  cmCTest *this_00;
  bool bVar2;
  uint uVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  string_view value;
  OutputLogger submodule_out;
  string top_dir;
  char *git_submodule_sync [5];
  string init_submodules;
  OutputLogger submodule_err;
  char *git_submodule [5];
  undefined1 local_148 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_108;
  string local_e8;
  undefined8 local_c8;
  string local_b8;
  OutputLogger local_98;
  pointer local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined8 local_38;
  
  bVar2 = UpdateInternal(this);
  if (!bVar2) {
    return false;
  }
  FindTopDir_abi_cxx11_(&local_108,this);
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  uVar3 = GetGitVersion(this);
  if (uVar3 < 0xa1d1c8) {
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,local_108._M_dataplus._M_p,
               local_108._M_dataplus._M_p + local_108._M_string_length);
    std::__cxx11::string::append(local_148);
    bVar2 = cmsys::SystemTools::FileExists((string *)local_148);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "Git < 1.6.5 cannot update submodules recursively\n",0x31);
    }
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = "--recursive";
  }
  uVar3 = GetGitVersion(this);
  if (uVar3 < 0xa4cf68) {
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,local_108._M_dataplus._M_p,
               local_108._M_dataplus._M_p + local_108._M_string_length);
    std::__cxx11::string::append(local_148);
    bVar2 = cmsys::SystemTools::FileExists((string *)local_148);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "Git < 1.8.1 cannot synchronize submodules recursively\n",0x36);
    }
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = "--recursive";
  }
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_148,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "submodule-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_98,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-err> ");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"GITInitSubmodules","");
  cmCTest::GetCTestConfiguration(&local_b8,this_00,&local_e8);
  pcVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    pcVar4 = extraout_RDX_00;
  }
  value._M_str = pcVar4;
  value._M_len = (size_t)local_b8._M_dataplus._M_p;
  bVar2 = cmValue::IsOn((cmValue *)local_b8._M_string_length,value);
  if (bVar2) {
    local_e8._M_string_length = 0x7fb4da;
    local_e8.field_2._M_allocated_capacity = (long)"cxx_nonstatic_member_init" + 0x15;
    local_e8.field_2._8_8_ = (char *)0x0;
    local_e8._M_dataplus._M_p = pcVar1;
    bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,(char **)&local_e8,(OutputParser *)local_148,
                                (OutputParser *)&local_98,local_108._M_dataplus._M_p,Auto);
    if (bVar2) goto LAB_005b7974;
  }
  else {
LAB_005b7974:
    local_e8._M_string_length = 0x7fb4da;
    local_e8.field_2._M_allocated_capacity = (long)"async" + 1;
    local_c8 = 0;
    local_e8._M_dataplus._M_p = pcVar1;
    local_e8.field_2._8_8_ = pcVar6;
    bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,(char **)&local_e8,(OutputParser *)local_148,
                                (OutputParser *)&local_98,local_108._M_dataplus._M_p,Auto);
    if (bVar2) {
      local_50 = "submodule";
      local_48 = "update";
      local_38 = 0;
      local_58 = pcVar1;
      local_40 = pcVar5;
      bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,&local_58,(OutputParser *)local_148,
                                  (OutputParser *)&local_98,local_108._M_dataplus._M_p,Auto);
      goto LAB_005b7a03;
    }
  }
  bVar2 = false;
LAB_005b7a03:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_009c4580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.super_LineParser.Line._M_dataplus._M_p != &local_98.super_LineParser.Line.field_2)
  {
    operator_delete(local_98.super_LineParser.Line._M_dataplus._M_p,
                    local_98.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_148._0_8_ = &PTR__LineParser_009c4580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._24_8_ != &local_120) {
    operator_delete((void *)local_148._24_8_,local_120._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if (!this->UpdateInternal()) {
    return false;
  }

  std::string top_dir = this->FindTopDir();
  const char* git = this->CommandLineTool.c_str();
  const char* recursive = "--recursive";
  const char* sync_recursive = "--recursive";

  // Git < 1.6.5 did not support submodule --recursive
  if (this->GetGitVersion() < cmCTestGITVersion(1, 6, 5, 0)) {
    recursive = nullptr;
    // No need to require >= 1.6.5 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.6.5 cannot update submodules recursively\n";
    }
  }

  // Git < 1.8.1 did not support sync --recursive
  if (this->GetGitVersion() < cmCTestGITVersion(1, 8, 1, 0)) {
    sync_recursive = nullptr;
    // No need to require >= 1.8.1 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.8.1 cannot synchronize submodules recursively\n";
    }
  }

  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");

  bool ret;

  std::string init_submodules =
    this->CTest->GetCTestConfiguration("GITInitSubmodules");
  if (cmIsOn(init_submodules)) {
    char const* git_submodule_init[] = { git, "submodule", "init", nullptr };
    ret = this->RunChild(git_submodule_init, &submodule_out, &submodule_err,
                         top_dir.c_str());

    if (!ret) {
      return false;
    }
  }

  char const* git_submodule_sync[] = { git, "submodule", "sync",
                                       sync_recursive, nullptr };
  ret = this->RunChild(git_submodule_sync, &submodule_out, &submodule_err,
                       top_dir.c_str());

  if (!ret) {
    return false;
  }

  char const* git_submodule[] = { git, "submodule", "update", recursive,
                                  nullptr };
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir.c_str());
}